

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

void rtr_mgr_stop(rtr_mgr_config *config)

{
  long lVar1;
  void *pvVar2;
  long *plVar3;
  ulong uVar4;
  tommy_list ptVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  ptVar5 = config->groups->list;
  lrtr_dbg("RTR_MGR: %s()","rtr_mgr_stop");
  for (; ptVar5 != (tommy_list)0x0; ptVar5 = ptVar5->next) {
    pvVar2 = ptVar5->data;
    plVar3 = *(long **)((long)pvVar2 + 0x20);
    if ((int)plVar3[1] != 0) {
      uVar4 = 0;
      do {
        rtr_stop(*(rtr_socket **)(*plVar3 + uVar4 * 8));
        uVar4 = uVar4 + 1;
        plVar3 = *(long **)((long)pvVar2 + 0x20);
      } while (uVar4 < *(uint *)(plVar3 + 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
    return;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT void rtr_mgr_stop(struct rtr_mgr_config *config)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	MGR_DBG("%s()", __func__);
	while (node) {
		struct rtr_mgr_group_node *group_node = node->data;

		for (unsigned int j = 0; j < group_node->group->sockets_len; j++)
			rtr_stop(group_node->group->sockets[j]);
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
}